

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

void __thiscall httplib::DataSink::~DataSink(DataSink *this)

{
  _Manager_type p_Var1;
  
  *(code **)&this->sb_ = std::_Rb_tree_increment;
  std::locale::~locale((locale *)&(this->sb_).field_0x38);
  std::ios_base::~ios_base((ios_base *)&this->field_0x68);
  p_Var1 = (this->is_writable).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->is_writable,(_Any_data *)&this->is_writable,__destroy_functor);
  }
  p_Var1 = (this->done).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->done,(_Any_data *)&this->done,__destroy_functor);
  }
  p_Var1 = (this->write).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)this,(_Any_data *)this,__destroy_functor);
  }
  return;
}

Assistant:

DataSink() : os(&sb_), sb_(*this) {}